

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::makeARCopy(KktCheck *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> iwork;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> local_40;
  
  this->tol = 1e-05;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,(long)this->numRow,&local_44,&local_45);
  this_00 = &this->ARstart;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)this->numRow + 1,&local_44);
  iVar7 = (int)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,(long)iVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,(long)iVar7);
  this->k = 0;
  if (0 < iVar7) {
    piVar1 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar6 = 0;
    do {
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar1[iVar6]] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar1[iVar6]] + 1;
      iVar6 = this->k + 1;
      this->k = iVar6;
    } while (iVar6 < iVar7);
  }
  this->i = 1;
  if (0 < this->numRow) {
    piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = 1;
    do {
      lVar8 = (long)iVar7;
      piVar1[lVar8] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar8 + -1] + piVar1[lVar8 + -1];
      iVar6 = this->i;
      iVar7 = iVar6 + 1;
      this->i = iVar7;
    } while (iVar6 < this->numRow);
  }
  this->i = 0;
  if (0 < this->numRow) {
    piVar1 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = 0;
    do {
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar7] = piVar1[iVar7];
      iVar7 = this->i + 1;
      this->i = iVar7;
    } while (iVar7 < this->numRow);
  }
  if (0 < this->numCol) {
    piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar7 = piVar1[lVar8];
      lVar9 = lVar8 + 1;
      this->k = iVar7;
      if (iVar7 < piVar1[lVar8 + 1]) {
        do {
          iVar7 = piVar2[iVar7];
          iVar6 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7];
          local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar7] = iVar6 + 1;
          piVar3[iVar6] = (int)lVar8;
          iVar7 = this->k;
          pdVar5[iVar6] = pdVar4[iVar7];
          iVar7 = iVar7 + 1;
          this->k = iVar7;
        } while (iVar7 < piVar1[lVar9]);
      }
      lVar8 = lVar9;
    } while (lVar9 < this->numCol);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KktCheck::makeARCopy() {
	tol = 0.00001;
	// Make a AR copy
	vector<int> iwork(numRow, 0);
	ARstart.resize(numRow + 1, 0);
	int AcountX = Aindex.size();
	ARindex.resize(AcountX);
	ARvalue.resize(AcountX);
	for (k = 0; k < AcountX; k++)
	    iwork[Aindex[k]]++;
	for (i = 1; i <= numRow; i++)
	    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
	for (i = 0; i < numRow; i++)
	    iwork[i] = ARstart[i];
	for (int iCol = 0; iCol < numCol; iCol++) {
	    for (k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
	        int iRow = Aindex[k];
	        int iPut = iwork[iRow]++;
	        ARindex[iPut] = iCol;
	        ARvalue[iPut] = Avalue[k];
	    }
	}
}